

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

int CoRoutineFunc(stCoRoutine_t *co,void *param_2)

{
  if (co->pfn != (pfn_co_routine_t)0x0) {
    (*co->pfn)(co->arg);
  }
  co->cEnd = '\x01';
  co_yield_env(co->env);
  return 0;
}

Assistant:

static int CoRoutineFunc( stCoRoutine_t *co,void * )
{
	if( co->pfn )
	{
		co->pfn( co->arg );
	}
	co->cEnd = 1;

	stCoRoutineEnv_t *env = co->env;

	co_yield_env( env );

	return 0;
}